

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O2

time_t DSTcorrect(time_t Start,time_t Future)

{
  int iVar1;
  tm *ptVar2;
  time_t Future_local;
  time_t Start_local;
  tm tmbuf;
  
  Future_local = Future;
  Start_local = Start;
  ptVar2 = localtime_r(&Start_local,(tm *)&tmbuf);
  iVar1 = ptVar2->tm_hour;
  ptVar2 = localtime_r(&Future_local,(tm *)&tmbuf);
  return (long)(((iVar1 + 1) % 0x18 - (ptVar2->tm_hour + 1) % 0x18) * 0xe10) +
         (Future_local - Start_local);
}

Assistant:

static time_t
DSTcorrect(time_t Start, time_t Future)
{
	time_t		StartDay;
	time_t		FutureDay;
	struct tm	*ltime;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE_LOCALTIME_S)
	struct tm	tmbuf;
#endif
#if defined(HAVE_LOCALTIME_S)
	ltime = localtime_s(&tmbuf, &Start) ? NULL : &tmbuf;
#elif defined(HAVE_LOCALTIME_R)
	ltime = localtime_r(&Start, &tmbuf);
#else
	ltime = localtime(&Start);
#endif
	StartDay = (ltime->tm_hour + 1) % 24;
#if defined(HAVE_LOCALTIME_S)
	ltime = localtime_s(&tmbuf, &Future) ? NULL : &tmbuf;
#elif defined(HAVE_LOCALTIME_R)
	ltime = localtime_r(&Future, &tmbuf);
#else
	ltime = localtime(&Future);
#endif
	FutureDay = (ltime->tm_hour + 1) % 24;
	return (Future - Start) + (StartDay - FutureDay) * HOUR;
}